

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.cpp
# Opt level: O0

void polyscope::screenshot(string *filename,bool transparentBG)

{
  element_type *peVar1;
  reference pvVar2;
  byte in_SIL;
  string *in_RDI;
  int ind;
  int i;
  int j;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buff;
  int h;
  int w;
  bool requestedAlready;
  int in_stack_0000009c;
  int in_stack_000000a0;
  int in_stack_000000a4;
  uchar *in_stack_000000a8;
  string *in_stack_000000b0;
  undefined7 in_stack_ffffffffffffff80;
  uchar in_stack_ffffffffffffff87;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  string local_60 [36];
  int local_3c;
  int local_38;
  int local_34;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  int local_14;
  int local_10;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  *(undefined1 *)(render::engine + 0x221) = 1;
  if (local_9 != 0) {
    *(undefined1 *)(render::engine + 0x220) = 1;
  }
  processLazyProperties();
  local_a = redrawRequested();
  requestRedraw();
  draw(buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish._7_1_,
       buff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish._6_1_);
  if ((local_a & 1) != 0) {
    requestRedraw();
  }
  local_10 = view::bufferWidth;
  local_14 = view::bufferHeight;
  peVar1 = std::
           __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3e82a0);
  (*peVar1->_vptr_FrameBuffer[0xf])(&local_30);
  if ((local_9 & 1) == 0) {
    for (local_34 = 0; local_34 < local_14; local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < local_10; local_38 = local_38 + 1) {
        local_3c = local_38 + local_34 * local_10;
        in_stack_ffffffffffffff87 =
             geometrycentral::surface::std::numeric_limits<unsigned_char>::max();
        pvVar2 = geometrycentral::surface::std::
                 vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&local_30,(long)(local_3c * 4 + 3));
        *pvVar2 = in_stack_ffffffffffffff87;
      }
    }
  }
  std::__cxx11::string::string(local_60,in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  saveImage(in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,
            in_stack_0000009c);
  std::__cxx11::string::~string(local_60);
  *(undefined1 *)(render::engine + 0x221) = 0;
  if ((local_9 & 1) != 0) {
    *(undefined1 *)(render::engine + 0x220) = 0;
  }
  geometrycentral::surface::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            (in_stack_ffffffffffffff90);
  return;
}

Assistant:

void screenshot(std::string filename, bool transparentBG) {

  render::engine->useAltDisplayBuffer = true;
  if (transparentBG) render::engine->lightCopy = true; // copy directly in to buffer without blending

  // == Make sure we render first
  processLazyProperties();

  // save the redraw requested bit and restore it below
  bool requestedAlready = redrawRequested();
  requestRedraw();

  draw(false, false);

  if (requestedAlready) {
    requestRedraw();
  }

  // these _should_ always be accurate
  int w = view::bufferWidth;
  int h = view::bufferHeight;
  std::vector<unsigned char> buff = render::engine->displayBufferAlt->readBuffer();

  // Set alpha to 1
  if (!transparentBG) {
    for (int j = 0; j < h; j++) {
      for (int i = 0; i < w; i++) {
        int ind = i + j * w;
        buff[4 * ind + 3] = std::numeric_limits<unsigned char>::max();
      }
    }
  }

  // Save to file
  saveImage(filename, &(buff.front()), w, h, 4);

  render::engine->useAltDisplayBuffer = false;
  if (transparentBG) render::engine->lightCopy = false;
}